

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtaptestlogger.cpp
# Opt level: O0

void __thiscall QTapTestLogger::QTapTestLogger(QTapTestLogger *this,char *filename)

{
  QAbstractTestLogger *in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  QAbstractTestLogger::QAbstractTestLogger(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_QAbstractTestLogger = (_func_int **)&PTR__QTapTestLogger_001e6fe8;
  QTestCharBuffer::QTestCharBuffer((QTestCharBuffer *)(in_RDI + 1));
  QTestCharBuffer::QTestCharBuffer((QTestCharBuffer *)(in_RDI + 0x22));
  QTestCharBuffer::QTestCharBuffer((QTestCharBuffer *)(in_RDI + 0x43));
  *(undefined1 *)&in_RDI[100]._vptr_QAbstractTestLogger = 0;
  return;
}

Assistant:

QTapTestLogger::QTapTestLogger(const char *filename)
    : QAbstractTestLogger(filename)
{
}